

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataset.h
# Opt level: O0

ptrdiff_t __thiscall soplex::DataSet<int>::reMax(DataSet<int> *this,int newmax)

{
  Item *pIVar1;
  int iVar2;
  int in_ESI;
  DataSet<int> *in_RDI;
  int *lastfree;
  Item *old_theitem;
  int local_34;
  int *local_20;
  
  pIVar1 = in_RDI->theitem;
  iVar2 = size(in_RDI);
  local_34 = in_ESI;
  if (in_ESI < iVar2) {
    local_34 = size(in_RDI);
  }
  for (local_20 = &in_RDI->firstfree; *local_20 != -1 - in_RDI->themax;
      local_20 = &in_RDI->theitem[-1 - *local_20].info) {
  }
  *local_20 = -1 - local_34;
  in_RDI->themax = local_34;
  spx_realloc<soplex::DataSet<int>::Item*>((Item **)old_theitem,lastfree._4_4_);
  spx_realloc<soplex::DataKey*>((DataKey **)old_theitem,lastfree._4_4_);
  return (long)in_RDI->theitem - (long)pIVar1;
}

Assistant:

ptrdiff_t reMax(int newmax = 0)
   {
      struct Item* old_theitem = theitem;
      newmax = (newmax < size()) ? size() : newmax;

      int* lastfree = &firstfree;

      while(*lastfree != -themax - 1)
         lastfree = &(theitem[ -1 - *lastfree].info);

      *lastfree = -newmax - 1;

      themax = newmax;
      spx_realloc(theitem, themax);
      spx_realloc(thekey,  themax);

      return reinterpret_cast<char*>(theitem)
             - reinterpret_cast<char*>(old_theitem);
   }